

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  pointer this;
  EVP_PKEY_CTX *in_RDI;
  FileException error;
  
  init(in_RDI);
  readFrames();
  this = std::unique_ptr<AviWriter,_std::default_delete<AviWriter>_>::operator->(&writer);
  AviWriter::completeOutputFile(this);
  std::unique_ptr<AviWriter,_std::default_delete<AviWriter>_>::reset(&writer,(pointer)0x0);
  return 0;
}

Assistant:

int main() {

    init();

    try {
        readFrames();
    } catch (const FileException error) {
        std::cerr << error.what() << std::endl;
        return 1;
    }

    writer->completeOutputFile();

    writer.reset(nullptr);

    return 0;
}